

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

bool anon_unknown.dwarf_5292d::arg_value_error(string *name,string *s,char *type)

{
  Logger *this;
  ostream *poVar1;
  allocator local_41;
  string local_40 [32];
  char *local_20;
  char *type_local;
  string *s_local;
  string *name_local;
  
  local_20 = type;
  type_local = (char *)s;
  s_local = name;
  this = GEO::Logger::instance();
  GEO::Logger::set_quiet(this,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"CmdLine",&local_41);
  poVar1 = GEO::Logger::err((string *)local_40);
  poVar1 = std::operator<<(poVar1,"Argument ");
  poVar1 = std::operator<<(poVar1,(string *)s_local);
  poVar1 = std::operator<<(poVar1," received a bad value: \'");
  poVar1 = std::operator<<(poVar1,(string *)type_local);
  poVar1 = std::operator<<(poVar1,"\' is not a ");
  poVar1 = std::operator<<(poVar1,local_20);
  poVar1 = std::operator<<(poVar1," value");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return false;
}

Assistant:

bool arg_value_error(
        const std::string& name,
        const std::string& s, const char* type
    ) {
        Logger::instance()->set_quiet(false);
        Logger::err("CmdLine")
            << "Argument " << name << " received a bad value: '"
            << s << "' is not a " << type << " value"
            << std::endl;
        return false;
    }